

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O2

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,int32_t *long_t,size_t numElements)

{
  char **ppcVar1;
  size_t sVar2;
  NotEnoughMemoryException *this_00;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  char local_20 [8];
  
  sVar2 = alignment(this,4);
  pcVar4 = (this->m_currentPosition).m_currentPosition;
  if (sVar2 + numElements * 4 <=
      (ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar4)) {
    this->m_lastDataSize = 4;
    if (numElements != 0) {
      pcVar4 = pcVar4 + sVar2;
      (this->m_currentPosition).m_currentPosition = pcVar4;
    }
    __n = numElements * 4;
    if (this->m_swapBytes == true) {
      pcVar4 = pcVar4 + 2;
      for (pcVar3 = local_20; pcVar3 < local_20 + __n; pcVar3 = pcVar3 + 4) {
        (this->m_currentPosition).m_currentPosition = pcVar4 + -1;
        pcVar3[3] = pcVar4[-2];
        (this->m_currentPosition).m_currentPosition = pcVar4;
        pcVar3[2] = pcVar4[-1];
        (this->m_currentPosition).m_currentPosition = pcVar4 + 1;
        pcVar3[1] = *pcVar4;
        (this->m_currentPosition).m_currentPosition = pcVar4 + 2;
        *pcVar3 = pcVar4[1];
        pcVar4 = pcVar4 + 4;
      }
    }
    else {
      memcpy(long_t,pcVar4,__n);
      ppcVar1 = &(this->m_currentPosition).m_currentPosition;
      *ppcVar1 = *ppcVar1 + __n;
    }
    return this;
  }
  this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
  exception::NotEnoughMemoryException::NotEnoughMemoryException
            (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
  __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
              exception::NotEnoughMemoryException::~NotEnoughMemoryException);
}

Assistant:

Cdr& Cdr::deserializeArray(int32_t *long_t, size_t numElements)
{
    size_t align = alignment(sizeof(*long_t));
    size_t totalSize = sizeof(*long_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if((m_lastPosition - m_currentPosition) >= sizeAligned)
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*long_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            char *dst = reinterpret_cast<char*>(&long_t);
            char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*long_t))
            {
                m_currentPosition++ >> dst[3];
                m_currentPosition++ >> dst[2];
                m_currentPosition++ >> dst[1];
                m_currentPosition++ >> dst[0];
            }
        }
        else
        {
            m_currentPosition.rmemcopy(long_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}